

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.h
# Opt level: O3

size_t __thiscall wasm::DisjointSets::getRoot(DisjointSets *this,size_t elem)

{
  pointer pEVar1;
  size_t sVar2;
  size_t sVar3;
  
  pEVar1 = (this->info).
           super__Vector_base<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar2 = elem;
  if ((ulong)((long)(this->info).
                    super__Vector_base<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 4) <= elem) {
    __assert_fail("elem < info.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/disjoint_sets.h"
                  ,0x2f,"size_t wasm::DisjointSets::getRoot(size_t)");
  }
  do {
    sVar3 = sVar2;
    sVar2 = pEVar1[sVar3].parent;
  } while (pEVar1[sVar3].parent != sVar3);
  if (sVar3 != elem) {
    do {
      sVar2 = pEVar1[elem].parent;
      pEVar1[elem].parent = sVar3;
      elem = sVar2;
    } while (sVar2 != sVar3);
  }
  return sVar3;
}

Assistant:

size_t getRoot(size_t elem) {
    assert(elem < info.size());
    size_t root = elem;
    // Follow parent pointers up to the root.
    for (; info[root].parent != root; root = info[root].parent) {
    }
    // Compress the path to make subsequent getRoots of this set faster.
    while (elem != root) {
      size_t parent = info[elem].parent;
      info[elem].parent = root;
      elem = parent;
    }
    return root;
  }